

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_set_feat(gauden_t *g,uint32 n_feat,uint32 *veclen)

{
  uint32 *__dest;
  ulong uVar1;
  ulong n_elem;
  
  g->n_feat = n_feat;
  n_elem = (ulong)n_feat;
  __dest = (uint32 *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x95);
  g->veclen = __dest;
  memcpy(__dest,veclen,n_elem * 4);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x98,"%d feature streams (",n_feat);
  if (n_feat != 0) {
    uVar1 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"|%d|=%d ",uVar1 & 0xffffffff,(ulong)g->veclen[uVar1]);
      uVar1 = uVar1 + 1;
    } while (n_elem != uVar1);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,")\n");
  return 0;
}

Assistant:

int
gauden_set_feat(gauden_t *g,
		uint32 n_feat,
		const uint32 *veclen)
{
    uint32 i;

    g->n_feat = n_feat;
    g->veclen = ckd_calloc(n_feat, sizeof(uint32));
    memcpy(g->veclen, veclen, n_feat * sizeof(uint32));

    E_INFO("%d feature streams (", n_feat);
    for (i = 0; i < n_feat; i++) {
	E_INFOCONT("|%d|=%d ", i, g->veclen[i]);
    }
    E_INFOCONT(")\n");

    return S3_SUCCESS;
}